

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::BuildNode::configureAttribute
          (BuildNode *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  ulong uVar1;
  undefined1 uVar2;
  Twine TStack_f8;
  Twine local_d8;
  Twine local_b8 [5];
  StringRef local_40;
  char *local_30;
  size_t local_28;
  
  local_28 = value.Length;
  local_30 = value.Data;
  local_40.Length = name.Length;
  local_40.Data = name.Data;
  uVar1 = local_40.Length - 4 >> 1;
  if ((uVar1 | (ulong)((local_40.Length - 4 & 1) != 0) << 0x3f) < 0xc) {
    uVar2 = (*(code *)(&DAT_001fddb0 + *(int *)(&DAT_001fddb0 + uVar1 * 4)))();
    return (bool)uVar2;
  }
  llvm::Twine::Twine(&local_d8,"unexpected attribute: \'",&local_40);
  llvm::Twine::Twine(&TStack_f8,"\'");
  llvm::operator+(local_b8,&local_d8,&TStack_f8);
  ConfigureContext::error(ctx,local_b8);
  return false;
}

Assistant:

bool BuildNode::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                   StringRef value) {
  if (name == "type") {
    if (value == "plain") {
      type = NodeType::Plain;
    } else if (value == "directory") {
      type = NodeType::Plain;
    } else if (value == "directory-structure") {
      type = NodeType::DirectoryStructure;
    } else if (value == "virtual") {
      type = NodeType::Virtual;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-directory") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::Directory;
    } else if (value == "false") {
      if (type == NodeType::Directory)
        type = NodeType::Plain;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-directory-structure") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::DirectoryStructure;
    } else if (value == "false") {
      if (type == NodeType::DirectoryStructure)
        type = NodeType::Plain;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-virtual") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::Virtual;
    } else if (value == "false") {
      if (type == NodeType::Virtual)
        type = NodeType::Plain;
      commandTimestamp = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-command-timestamp") {
    if (value == "true") {
      commandTimestamp = true;
      type = NodeType::Virtual;
    } else if (value == "false") {
      commandTimestamp = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-mutated") {
    if (value == "true") {
      mutated = true;
    } else if (value == "false") {
      mutated = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "content-exclusion-patterns") {
    exclusionPatterns = basic::StringList(value);
    return true;
  }
    
  // We don't support any other custom attributes.
  ctx.error("unexpected attribute: '" + name + "'");
  return false;
}